

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall SpikeEvent::SpikeEvent(SpikeEvent *this,int n_multiplicity,double n_weight)

{
  Clock *this_00;
  undefined4 in_ESI;
  Event *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar1;
  
  Event::Event(in_RDI);
  in_RDI->_vptr_Event = (_func_int **)&PTR_setWeight_0012ba18;
  *(undefined4 *)&in_RDI[1]._vptr_Event = 1;
  *(undefined8 *)&in_RDI[1].type = 0x3ff0000000000000;
  in_RDI->type = Spike;
  this_00 = Clock::getInstance();
  dVar1 = Clock::getCurrentTime(this_00);
  in_RDI->eventTime = dVar1;
  *(undefined4 *)&in_RDI[1]._vptr_Event = in_ESI;
  *(undefined8 *)&in_RDI[1].type = in_XMM0_Qa;
  return;
}

Assistant:

SpikeEvent(int n_multiplicity, double n_weight) {
        type = EventType::Spike;
        eventTime = Clock::getInstance()->getCurrentTime();
        multiplicity = n_multiplicity;
        weight = n_weight;
    }